

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_matrix.cpp
# Opt level: O3

Reals Omega_h::repeat_matrix<2>(LO n,Tensor<2> m)

{
  undefined1 auVar1 [16];
  Vector<4> v;
  undefined4 in_register_0000003c;
  Reals RVar2;
  Reals RVar3;
  undefined8 uStack_18;
  
  RVar3.write_.shared_alloc_.alloc._4_4_ = in_register_0000003c;
  RVar3.write_.shared_alloc_.alloc._0_4_ = n;
  auVar1._8_4_ = m.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1]._0_4_;
  auVar1._0_8_ = m.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0];
  auVar1._12_4_ = m.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1]._4_4_;
  uStack_18 = auVar1._8_8_;
  v.super_Few<double,_4>.array_[1] =
       m.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0];
  v.super_Few<double,_4>.array_[0] =
       m.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0];
  v.super_Few<double,_4>.array_[2] = (double)uStack_18;
  v.super_Few<double,_4>.array_[3] =
       m.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1];
  RVar2 = repeat_vector<4>(n,v);
  RVar3.write_.shared_alloc_.direct_ptr = RVar2.write_.shared_alloc_.direct_ptr;
  return (Reals)RVar3.write_.shared_alloc_;
}

Assistant:

Reals repeat_matrix(LO const n, Tensor<dim> const m) {
  return repeat_vector(n, matrix2vector(m));
}